

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::MessageGenerator
          (MessageGenerator *this,string *root_classname,Descriptor *descriptor,Options *options)

{
  int iVar1;
  Options *descriptor_00;
  int iVar2;
  FileDescriptor *file;
  ExtensionGenerator *this_00;
  FieldDescriptor *descriptor_01;
  OneofGenerator *this_01;
  OneofDescriptor *descriptor_02;
  EnumGenerator *this_02;
  EnumDescriptor *descriptor_03;
  MessageGenerator *this_03;
  Descriptor *descriptor_04;
  Descriptor *descriptor_05;
  MessageGenerator *local_70;
  MessageGenerator *generator_2;
  EnumGenerator *pEStack_60;
  int i_3;
  EnumGenerator *generator_1;
  OneofGenerator *pOStack_50;
  int i_2;
  OneofGenerator *generator;
  ExtensionGenerator *pEStack_40;
  int i_1;
  int local_38;
  int i;
  Options *local_28;
  Options *options_local;
  Descriptor *descriptor_local;
  string *root_classname_local;
  MessageGenerator *this_local;
  
  local_28 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (Descriptor *)root_classname;
  root_classname_local = &this->root_classname_;
  std::__cxx11::string::string((string *)this,(string *)root_classname);
  this->descriptor_ = (Descriptor *)options_local;
  FieldGeneratorMap::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)options_local,local_28);
  ClassName_abi_cxx11_(&this->class_name_,(objectivec *)this->descriptor_,descriptor_05);
  descriptor_00 = options_local;
  file = Descriptor::file((Descriptor *)options_local);
  GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
            (&this->deprecated_attribute_,(Descriptor *)descriptor_00,file,false,true);
  std::
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ::vector(&this->extension_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ::vector(&this->enum_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ::vector(&this->nested_message_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
  ::vector(&this->oneof_generators_);
  local_38 = 0;
  while( true ) {
    iVar1 = local_38;
    iVar2 = Descriptor::extension_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_00 = (ExtensionGenerator *)operator_new(0x48);
    descriptor_01 = Descriptor::extension(this->descriptor_,local_38);
    ExtensionGenerator::ExtensionGenerator(this_00,&this->class_name_,descriptor_01);
    pEStack_40 = this_00;
    std::
    vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
    ::push_back(&this->extension_generators_,&stack0xffffffffffffffc0);
    local_38 = local_38 + 1;
  }
  generator._4_4_ = 0;
  while( true ) {
    iVar1 = generator._4_4_;
    iVar2 = Descriptor::oneof_decl_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_01 = (OneofGenerator *)operator_new(0x38);
    descriptor_02 = Descriptor::oneof_decl(this->descriptor_,generator._4_4_);
    OneofGenerator::OneofGenerator(this_01,descriptor_02);
    pOStack_50 = this_01;
    std::
    vector<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
    ::push_back(&this->oneof_generators_,&stack0xffffffffffffffb0);
    generator._4_4_ = generator._4_4_ + 1;
  }
  generator_1._4_4_ = 0;
  while( true ) {
    iVar1 = generator_1._4_4_;
    iVar2 = Descriptor::enum_type_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_02 = (EnumGenerator *)operator_new(0x58);
    descriptor_03 = Descriptor::enum_type(this->descriptor_,generator_1._4_4_);
    EnumGenerator::EnumGenerator(this_02,descriptor_03);
    pEStack_60 = this_02;
    std::
    vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
    ::push_back(&this->enum_generators_,&stack0xffffffffffffffa0);
    generator_1._4_4_ = generator_1._4_4_ + 1;
  }
  generator_2._4_4_ = 0;
  while( true ) {
    iVar1 = generator_2._4_4_;
    iVar2 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_03 = (MessageGenerator *)operator_new(0xe0);
    descriptor_04 = Descriptor::nested_type(this->descriptor_,generator_2._4_4_);
    MessageGenerator(this_03,&this->root_classname_,descriptor_04,local_28);
    local_70 = this_03;
    std::
    vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
    ::push_back(&this->nested_message_generators_,&local_70);
    generator_2._4_4_ = generator_2._4_4_ + 1;
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const string& root_classname,
                                   const Descriptor* descriptor,
                                   const Options& options)
    : root_classname_(root_classname),
      descriptor_(descriptor),
      field_generators_(descriptor, options),
      class_name_(ClassName(descriptor_)),
      deprecated_attribute_(
          GetOptionalDeprecatedAttribute(descriptor, descriptor->file(), false, true)) {

  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_.push_back(
        new ExtensionGenerator(class_name_, descriptor_->extension(i)));
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    OneofGenerator* generator = new OneofGenerator(descriptor_->oneof_decl(i));
    oneof_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator* generator = new EnumGenerator(descriptor_->enum_type(i));
    enum_generators_.push_back(generator);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator* generator =
        new MessageGenerator(root_classname_,
                             descriptor_->nested_type(i),
                             options);
    nested_message_generators_.push_back(generator);
  }
}